

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

void __thiscall cppforth::Forth::markerremove(Forth *this)

{
  uint *puVar1;
  pointer pDVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  requireDStackDepth(this,1,"MARKERREMOVE");
  uVar3 = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  uVar4 = (ulong)uVar3;
  lVar5 = uVar4 * 0x50 + 0x48;
  for (; pDVar2 = (this->definitions).
                  super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                  ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(this->definitions).
                             super__Vector_base<cppforth::Forth::Definition,_std::allocator<cppforth::Forth::Definition>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar2) / 0x50);
      uVar4 = uVar4 + 1) {
    puVar1 = (uint *)((long)&pDVar2->code + lVar5);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar1 + -10),
               "_deleted");
    if ((*puVar1 & puVar1[-0xc]) == 0) {
      *(uint *)((long)pDVar2 + lVar5 + -0x30) = *puVar1 ^ puVar1[-0xc];
    }
    lVar5 = lVar5 + 0x50;
  }
  return;
}

Assistant:

void markerremove() {
			REQUIRE_DSTACK_DEPTH(1, "MARKERREMOVE");
			Cell defn = dStack.getTop(); dStack.pop();
			for (size_t i = defn; i<definitions.size(); ++i) {
				auto& def = definitions[i];
				def.name.append("_deleted");
				if (!def.isHidden()) {
					def.toggleHidden();
				}
			}
		}